

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

void __thiscall
Potassco::SmodelsConvert::acycEdge(SmodelsConvert *this,int s,int t,LitSpan *condition)

{
  SmData *this_00;
  Atom_t atom;
  StringBuilder buf;
  Span<char> local_78;
  StringBuilder local_68;
  
  if (this->ext_ == false) {
    (*this->out_->_vptr_AbstractProgram[0xc])(this->out_,(ulong)(uint)s,(ulong)(uint)t,condition);
  }
  StringBuilder::StringBuilder(&local_68);
  StringBuilder::appendFormat(&local_68,"_edge(%d,%d)",(ulong)(uint)s,(ulong)(uint)t);
  this_00 = this->data_;
  atom = makeAtom(this,condition,true);
  local_78 = StringBuilder::toSpan(&local_68);
  SmData::addOutput(this_00,atom,&local_78,false);
  StringBuilder::~StringBuilder(&local_68);
  return;
}

Assistant:

void SmodelsConvert::acycEdge(int s, int t, const LitSpan& condition) {
	if (!ext_) { out_.acycEdge(s, t, condition); }
	StringBuilder buf;
	buf.appendFormat("_edge(%d,%d)", s, t);
	data_->addOutput(makeAtom(condition, true), toSpan(buf), false);
}